

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O3

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  pointer *pppeVar1;
  wclass *pwVar2;
  iterator __position;
  bool bVar3;
  pointer ppeVar4;
  pointer ppeVar5;
  long lVar6;
  ulong uVar7;
  wclass wc;
  wclass local_48;
  vector<example*,std::allocator<example*>> *local_38;
  
  bVar3 = CB::ec_is_example_header
                    (*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  ppeVar5 = (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  c->action_sum =
       (c->action_sum - (ulong)bVar3) +
       ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3);
  c->event_sum = c->event_sum + 1;
  if ((c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar5) {
    (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar5;
  }
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar4 != ppeVar5) {
    local_38 = (vector<example*,std::allocator<example*>> *)&c->mtr_ec_seq;
    lVar6 = 0;
    uVar7 = 0;
    do {
      pwVar2 = (ppeVar5[uVar7]->l).cs.costs._begin;
      local_48.partial_prediction = 0.0;
      local_48.wap_value = 0.0;
      if (uVar7 == 0 && bVar3) {
        local_48.x = -3.4028235e+38;
        local_48.class_index = 0;
LAB_002707e4:
        __position._M_current =
             (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                    (local_38,__position,(example **)((long)ppeVar5 + lVar6));
        }
        else {
          *__position._M_current = *(example **)((long)ppeVar5 + lVar6);
          pppeVar1 = &(c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppeVar1 = *pppeVar1 + 1;
        }
        v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_48);
        ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else if ((long)(ppeVar5[uVar7]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        local_48.x = pwVar2->x;
        if ((local_48.x != 3.4028235e+38) || (NAN(local_48.x))) {
          local_48.class_index = 0;
          c->mtr_example = (uint32_t)uVar7;
          ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_002707e4;
        }
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar7 < (ulong)((long)ppeVar4 - (long)ppeVar5 >> 3));
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  bool shared = CB::ec_is_example_header(*(ec_seq[0]));
  c.action_sum += ec_seq.size();
  if (shared)
    c.action_sum -= 1;
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (shared && i == 0)
    {
      wc.x = -FLT_MAX;
      keep_example = true;
    }
    else if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}